

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_open(Curl_easy **curl)

{
  int *piVar1;
  dynbuf *s;
  CURLcode CVar2;
  Curl_easy *data;
  CURLcode CVar3;
  
  data = (Curl_easy *)(*Curl_ccalloc)(1,0x14d8);
  if (data == (Curl_easy *)0x0) {
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    data->magic = 0xc0dedbad;
    *(undefined4 *)&data->id = 0xffffffff;
    *(undefined4 *)((long)&data->id + 4) = 0xffffffff;
    data->mid = 0xffffffff;
    data->master_mid = 0xffffffff;
    *(undefined4 *)&(data->state).lastconnect_id = 0xffffffff;
    *(undefined4 *)((long)&(data->state).lastconnect_id + 4) = 0xffffffff;
    *(undefined4 *)&(data->state).recent_conn_id = 0xffffffff;
    *(undefined4 *)((long)&(data->state).recent_conn_id + 4) = 0xffffffff;
    piVar1 = &(data->progress).flags;
    *(byte *)piVar1 = (byte)*piVar1 | 0x10;
    (data->state).current_speed = -1;
    Curl_hash_init(&data->meta_hash,0x17,Curl_hash_str,Curl_str_key_compare,easy_meta_freeentry);
    s = &(data->state).headerb;
    Curl_dyn_init(s,0x19000);
    Curl_req_init(&data->req);
    Curl_initinfo(data);
    CVar3 = CURLE_OK;
    Curl_llist_init(&(data->state).httphdrs,(Curl_llist_dtor)0x0);
    Curl_netrc_init(&(data->state).netrc);
    CVar2 = Curl_init_userdefined(data);
    if (CVar2 == CURLE_OK) {
      *curl = data;
    }
    else {
      Curl_dyn_free(s);
      Curl_freeset(data);
      Curl_req_free(&data->req,data);
      Curl_hash_destroy(&data->meta_hash);
      data->magic = 0;
      (*Curl_cfree)(data);
      CVar3 = CVar2;
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_open(struct Curl_easy **curl)
{
  CURLcode result;
  struct Curl_easy *data;

  /* simple start-up: alloc the struct, init it with zeroes and return */
  data = calloc(1, sizeof(struct Curl_easy));
  if(!data) {
    /* this is a serious error */
    DEBUGF(fprintf(stderr, "Error: calloc of Curl_easy failed\n"));
    return CURLE_OUT_OF_MEMORY;
  }

  data->magic = CURLEASY_MAGIC_NUMBER;
  /* most recent connection is not yet defined */
  data->state.lastconnect_id = -1;
  data->state.recent_conn_id = -1;
  /* and not assigned an id yet */
  data->id = -1;
  data->mid = UINT_MAX;
  data->master_mid = UINT_MAX;
  data->progress.flags |= PGRS_HIDE;
  data->state.current_speed = -1; /* init to negative == impossible */

  Curl_hash_init(&data->meta_hash, 23,
                 Curl_hash_str, Curl_str_key_compare, easy_meta_freeentry);
  Curl_dyn_init(&data->state.headerb, CURL_MAX_HTTP_HEADER);
  Curl_req_init(&data->req);
  Curl_initinfo(data);
#ifndef CURL_DISABLE_HTTP
  Curl_llist_init(&data->state.httphdrs, NULL);
#endif
  Curl_netrc_init(&data->state.netrc);

  result = Curl_init_userdefined(data);

  if(result) {
    Curl_dyn_free(&data->state.headerb);
    Curl_freeset(data);
    Curl_req_free(&data->req, data);
    Curl_hash_destroy(&data->meta_hash);
    data->magic = 0;
    free(data);
    data = NULL;
  }
  else
    *curl = data;
  return result;
}